

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O2

void __thiscall Measurement_ops_Test::Measurement_ops_Test(Measurement_ops_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001ad4c0;
  return;
}

Assistant:

TEST(Measurement, ops)
{
    measurement d1(45.0, m);
    measurement d2(79, m);

    auto area = d1 * d2;
    EXPECT_EQ(area.value(), 45.0 * 79);
    EXPECT_TRUE(area.units() == m * m);

    EXPECT_TRUE(d1 * d2 == d2 * d1);

    auto sum = d1 + d2;
    EXPECT_EQ(sum.value(), 45.0 + 79.0);
    EXPECT_TRUE(sum.units() == m);
    EXPECT_TRUE(d1 + d2 == d2 + d1);

    auto diff = d2 - d1;
    EXPECT_EQ(diff.value(), 79.0 - 45);
    EXPECT_TRUE(diff.units() == m);

    auto rat = d1 / d2;
    EXPECT_EQ(rat.value(), 45.0 / 79);
    EXPECT_TRUE(rat.units() == ratio);

    EXPECT_TRUE(2.0 / m == measurement(2.0, m.inv()));
    EXPECT_TRUE(m / 2.0 == measurement(0.5, m));
    EXPECT_TRUE(m * 2.0 == measurement(2.0, m));

    // equivalent to asking how much is left over if you divide a 2 m object
    // into  6 inch chunks
    auto fd11 = (2.0 * m) % (6 * in);
    EXPECT_LT(fd11, (6 * in));

    EXPECT_TRUE(is_valid(d1));
}